

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint128_fallback fmt::v10::detail::umul128(uint64_t x,uint64_t y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t local_38;
  uint128_opt p;
  uint64_t y_local;
  uint64_t x_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = x;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = y;
  local_38 = SUB168(auVar1 * auVar2,0);
  p._0_8_ = SUB168(auVar1 * auVar2,8);
  uint128_fallback::uint128_fallback((uint128_fallback *)&x_local,(uint64_t)p,local_38);
  return _x_local;
}

Assistant:

inline auto umul128(uint64_t x, uint64_t y) noexcept -> uint128_fallback {
#if FMT_USE_INT128
  auto p = static_cast<uint128_opt>(x) * static_cast<uint128_opt>(y);
  return {static_cast<uint64_t>(p >> 64), static_cast<uint64_t>(p)};
#elif defined(_MSC_VER) && defined(_M_X64)
  auto hi = uint64_t();
  auto lo = _umul128(x, y, &hi);
  return {hi, lo};
#else
  const uint64_t mask = static_cast<uint64_t>(max_value<uint32_t>());

  uint64_t a = x >> 32;
  uint64_t b = x & mask;
  uint64_t c = y >> 32;
  uint64_t d = y & mask;

  uint64_t ac = a * c;
  uint64_t bc = b * c;
  uint64_t ad = a * d;
  uint64_t bd = b * d;

  uint64_t intermediate = (bd >> 32) + (ad & mask) + (bc & mask);

  return {ac + (intermediate >> 32) + (ad >> 32) + (bc >> 32),
          (intermediate << 32) + (bd & mask)};
#endif
}